

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::FunctionResolver::throwErrorForUnknownFunction
          (FunctionResolver *this,CallOrCast *call,QualifiedIdentifier *name)

{
  ResolutionPass *pRVar1;
  bool bVar2;
  Scope *this_00;
  Context *pCVar3;
  size_t __val;
  pool_ref<soul::AST::ASTObject> *ppVar4;
  EndpointDeclaration *pEVar5;
  string *name_00;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  IdentifierPath local_518;
  CompileMessage local_4c0;
  IdentifierPath local_488;
  CompileMessage local_430;
  IdentifierPath local_3f8;
  Identifier local_3a0;
  undefined1 local_398 [8];
  string possibleFunction;
  CompileMessage local_370;
  pool_ref<soul::AST::ASTObject> local_338;
  pool_ptr<soul::AST::EndpointDeclaration> local_330;
  pool_ptr<soul::AST::EndpointDeclaration> e;
  pool_ref<soul::AST::ASTObject> local_2f0;
  undefined1 local_2e8 [32];
  IdentifierPath local_2c8;
  CompileMessage local_270;
  pool_ref<soul::AST::ASTObject> local_238;
  pool_ref<soul::AST::ASTObject> *local_230;
  pool_ref<soul::AST::ASTObject> *i;
  pool_ref<soul::AST::ASTObject> *__end2;
  pool_ref<soul::AST::ASTObject> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *__range2;
  size_t numFunctions;
  IdentifierPath local_200;
  IdentifierPath local_1a8;
  Scope *local_150;
  Scope *scope;
  IdentifierPath local_138;
  undefined1 local_e0 [8];
  NameSearch search;
  QualifiedIdentifier *name_local;
  CallOrCast *call_local;
  FunctionResolver *this_local;
  
  search._184_8_ = name;
  AST::Scope::NameSearch::NameSearch((NameSearch *)local_e0);
  AST::QualifiedIdentifier::getPath(&local_138,(QualifiedIdentifier *)search._184_8_);
  IdentifierPath::operator=((IdentifierPath *)(search.itemsFound.space + 7),&local_138);
  IdentifierPath::~IdentifierPath(&local_138);
  search.partiallyQualifiedPath.pathSections.space[7]._0_1_ = 1;
  search.stopAtFirstScopeWithResults = true;
  search._177_1_ = 1;
  search._178_1_ = 1;
  search._179_1_ = 1;
  search.requiredNumFunctionArgs._0_1_ = 1;
  search.requiredNumFunctionArgs._1_1_ = 0;
  search.requiredNumFunctionArgs._2_1_ = 1;
  local_150 = AST::ASTObject::getParentScope((ASTObject *)search._184_8_);
  if (local_150 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(local_150,(NameSearch *)local_e0,(Statement *)0x0);
  }
  AST::QualifiedIdentifier::getPath(&local_1a8,(QualifiedIdentifier *)search._184_8_);
  bVar2 = IdentifierPath::isUnqualified(&local_1a8);
  IdentifierPath::~IdentifierPath(&local_1a8);
  if (bVar2) {
    pRVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).owner;
    numFunctions = (size_t)IdentifierPath::getLastPart
                                     ((IdentifierPath *)(search.itemsFound.space + 7));
    IdentifierPath::withSuffix(&local_200,&pRVar1->intrinsicsNamespacePath,(Identifier)numFunctions)
    ;
    IdentifierPath::operator=((IdentifierPath *)(search.itemsFound.space + 7),&local_200);
    IdentifierPath::~IdentifierPath(&local_200);
    this_00 = AST::ASTObject::getParentScope((ASTObject *)call);
    AST::Scope::performFullNameSearch(this_00,(NameSearch *)local_e0,(Statement *)0x0);
  }
  __range2 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)0x0;
  __begin2 = (pool_ref<soul::AST::ASTObject> *)local_e0;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)__begin2)
  ;
  i = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::end
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)__begin2);
  for (; __end2 != i; __end2 = __end2 + 1) {
    local_230 = __end2;
    local_238 = (pool_ref<soul::AST::ASTObject>)__end2->object;
    bVar2 = is_type<soul::AST::Function,soul::AST::ASTObject>(&local_238);
    pool_ref<soul::AST::ASTObject>::~pool_ref(&local_238);
    if (bVar2) {
      __range2 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                 ((long)&__range2->items + 1);
    }
  }
  if (__range2 != (ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)0x0) {
    pCVar3 = (Context *)(search._184_8_ + 0x10);
    AST::QualifiedIdentifier::getPath(&local_2c8,(QualifiedIdentifier *)search._184_8_);
    __val = AST::CallOrCastBase::getNumArguments(&call->super_CallOrCastBase);
    std::__cxx11::to_string((string *)local_2e8,__val);
    Errors::noFunctionWithNumberOfArgs<soul::IdentifierPath,std::__cxx11::string>
              (&local_270,(Errors *)&local_2c8,(IdentifierPath *)local_2e8,in_RCX);
    AST::Context::throwError(pCVar3,&local_270,false);
  }
  bVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::empty
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)local_e0);
  if (!bVar2) {
    ppVar4 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                       ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                        local_e0);
    local_2f0.object = ppVar4->object;
    bVar2 = is_type<soul::AST::Processor,soul::AST::ASTObject>(&local_2f0);
    pool_ref<soul::AST::ASTObject>::~pool_ref(&local_2f0);
    if (bVar2) {
      pCVar3 = (Context *)(search._184_8_ + 0x10);
      Errors::cannotUseProcessorAsFunction<>();
      AST::Context::throwError(pCVar3,(CompileMessage *)&e,false);
    }
    ppVar4 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                       ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                        local_e0);
    local_338.object = ppVar4->object;
    cast<soul::AST::EndpointDeclaration,soul::AST::ASTObject>((soul *)&local_330,&local_338);
    pool_ref<soul::AST::ASTObject>::~pool_ref(&local_338);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_330);
    if (bVar2) {
      pCVar3 = (Context *)(search._184_8_ + 0x10);
      possibleFunction.field_2._M_local_buf[0xf] = '\0';
      possibleFunction.field_2._M_local_buf[0xe] = '\0';
      pEVar5 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_330);
      if ((pEVar5->isInput & 1U) == 0) {
        Errors::cannotUseOutputAsFunction<>();
        possibleFunction.field_2._M_local_buf[0xe] = '\x01';
      }
      else {
        Errors::cannotUseInputAsFunction<>();
        possibleFunction.field_2._M_local_buf[0xf] = '\x01';
      }
      AST::Context::throwError(pCVar3,&local_370,false);
    }
    pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_330);
  }
  AST::QualifiedIdentifier::getPath(&local_3f8,(QualifiedIdentifier *)search._184_8_);
  local_3a0 = IdentifierPath::getLastPart(&local_3f8);
  name_00 = Identifier::operator_cast_to_string_(&local_3a0);
  findPossibleMisspeltFunction((string *)local_398,this,name_00);
  IdentifierPath::~IdentifierPath(&local_3f8);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    pCVar3 = (Context *)(search._184_8_ + 0x10);
    AST::QualifiedIdentifier::getPath(&local_518,(QualifiedIdentifier *)search._184_8_);
    Errors::unknownFunction<soul::IdentifierPath>(&local_4c0,&local_518);
    AST::Context::throwError(pCVar3,&local_4c0,false);
  }
  pCVar3 = (Context *)(search._184_8_ + 0x10);
  AST::QualifiedIdentifier::getPath(&local_488,(QualifiedIdentifier *)search._184_8_);
  Errors::unknownFunctionWithSuggestion<soul::IdentifierPath,std::__cxx11::string&>
            (&local_430,(Errors *)&local_488,(IdentifierPath *)local_398,in_RCX);
  AST::Context::throwError(pCVar3,&local_430,false);
}

Assistant:

void throwErrorForUnknownFunction (AST::CallOrCast& call, AST::QualifiedIdentifier& name)
        {
            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = name.getPath();
            search.stopAtFirstScopeWithResults = true;
            search.findVariables = true;
            search.findTypes = true;
            search.findFunctions = true;
            search.findNamespaces = true;
            search.findProcessors = true;
            search.findProcessorInstances = false;
            search.findEndpoints = true;

            if (auto scope = name.getParentScope())
                scope->performFullNameSearch (search, nullptr);

            if (name.getPath().isUnqualified())
            {
                search.partiallyQualifiedPath = owner.intrinsicsNamespacePath.withSuffix (search.partiallyQualifiedPath.getLastPart());
                call.getParentScope()->performFullNameSearch (search, nullptr);
            }

            size_t numFunctions = 0;

            for (auto& i : search.itemsFound)
                if (is_type<AST::Function> (i))
                    ++numFunctions;

            if (numFunctions > 0)
                name.context.throwError (Errors::noFunctionWithNumberOfArgs (name.getPath(),
                                                                             std::to_string (call.getNumArguments())));

            if (! search.itemsFound.empty())
            {
                if (is_type<AST::Processor> (search.itemsFound.front()))
                    name.context.throwError (Errors::cannotUseProcessorAsFunction());

                if (auto e = cast<AST::EndpointDeclaration> (search.itemsFound.front()))
                    name.context.throwError (e->isInput ? Errors::cannotUseInputAsFunction()
                                                        : Errors::cannotUseOutputAsFunction());
            }

            auto possibleFunction = findPossibleMisspeltFunction (name.getPath().getLastPart());

            if (! possibleFunction.empty())
                name.context.throwError (Errors::unknownFunctionWithSuggestion (name.getPath(), possibleFunction));

            name.context.throwError (Errors::unknownFunction (name.getPath()));
        }